

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::NewData(FlowBuffer *this,const_byteptr begin,const_byteptr end)

{
  ClearPreviousData(this);
  this->orig_data_begin_ = begin;
  this->orig_data_end_ = end;
  this->data_seq_at_orig_data_end_ = this->data_seq_at_orig_data_end_ + ((int)end - (int)begin);
  MarkOrCopy(this);
  return;
}

Assistant:

void FlowBuffer::NewData(const_byteptr begin, const_byteptr end)
	{
	BINPAC_ASSERT(begin <= end);

	ClearPreviousData();

	BINPAC_ASSERT((buffer_n_ == 0 && message_complete_) || orig_data_begin_ == orig_data_end_);

	orig_data_begin_ = begin;
	orig_data_end_ = end;
	data_seq_at_orig_data_end_ += (end - begin);

	MarkOrCopy();
	}